

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

bool __thiscall reflection::KeyValue::Verify(KeyValue *this,Verifier *verifier)

{
  bool bVar1;
  String *pSVar2;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    pSVar2 = key(this);
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar2);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,6), bVar1
       )) {
      pSVar2 = value(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar2);
      if (bVar1) {
        verifier->depth_ = verifier->depth_ - 1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_KEY) &&
           verifier.VerifyString(key()) &&
           VerifyOffset(verifier, VT_VALUE) &&
           verifier.VerifyString(value()) &&
           verifier.EndTable();
  }